

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<TestResult_(mp::Reference)>::UntypedPerformAction
          (FunctionMockerBase<TestResult_(mp::Reference)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<TestResult> *pAVar1;
  Action<TestResult_(mp::Reference)> *in_RDX;
  ArgumentTuple *args;
  Action<TestResult_(mp::Reference)> action;
  Action<TestResult_(mp::Reference)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<TestResult_(mp::Reference)> local_28;
  Action<TestResult_(mp::Reference)> *local_18;
  
  local_18 = in_RDX;
  Action<TestResult_(mp::Reference)>::Action(&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<TestResult>::PerformAction<TestResult(mp::Reference)>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<TestResult_(mp::Reference)>::~Action((Action<TestResult_(mp::Reference)> *)0x16a581);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }